

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O0

void __thiscall topk_algorithms::TopK::sort(TopK *this)

{
  iterator __first;
  iterator __last;
  TopK *this_local;
  
  __first = std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>::begin(&this->_entries);
  __last = std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>::end(&this->_entries);
  std::
  sort<__gnu_cxx::__normal_iterator<rank::KeyValue*,std::vector<rank::KeyValue,std::allocator<rank::KeyValue>>>,bool(*)(rank::KeyValue_const&,rank::KeyValue_const&)>
            ((__normal_iterator<rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
              )__first._M_current,
             (__normal_iterator<rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
              )__last._M_current,topk_sort_cmp);
  return;
}

Assistant:

void TopK::sort() {
        std::sort(_entries.begin(), _entries.end(), topk_sort_cmp);
    }